

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nan.cc
# Opt level: O1

void anon_unknown.dwarf_2e9d::PrintUsage(ostream *stream)

{
  char cVar1;
  
  cVar1 = (char)stream;
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream," nan - find NaN and Infinity values",0x23);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  usage:",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       nan [ options ] [ infile ] > stdout",0x2a);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  options:",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -h    : print this message",0x21);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  infile:",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       data sequence              (double)[stdin]",0x31);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  stdout:",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"       result messages",0x16);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream," SPTK: version ",0xf);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"4.3",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  return;
}

Assistant:

void PrintUsage(std::ostream* stream) {
  // clang-format off
  *stream << std::endl;
  *stream << " nan - find NaN and Infinity values" << std::endl;
  *stream << std::endl;
  *stream << "  usage:" << std::endl;
  *stream << "       nan [ options ] [ infile ] > stdout" << std::endl;
  *stream << "  options:" << std::endl;
  *stream << "       -h    : print this message" << std::endl;
  *stream << "  infile:" << std::endl;
  *stream << "       data sequence              (double)[stdin]" << std::endl;
  *stream << "  stdout:" << std::endl;
  *stream << "       result messages" << std::endl;
  *stream << std::endl;
  *stream << " SPTK: version " << sptk::kVersion << std::endl;
  *stream << std::endl;
  // clang-format on
}